

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_AddNullToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *null;
  char *name_local;
  cJSON *object_local;
  
  object_local = cJSON_CreateNull();
  cVar1 = add_item_to_object(object,name,object_local,&global_hooks,0);
  if (cVar1 == 0) {
    cJSON_Delete(object_local);
    object_local = (cJSON *)0x0;
  }
  return object_local;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddNullToObject(cJSON * const object, const char * const name)
{
    cJSON *null = cJSON_CreateNull();
    if (add_item_to_object(object, name, null, &global_hooks, false))
    {
        return null;
    }

    cJSON_Delete(null);
    return NULL;
}